

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concurrentqueue.h
# Opt level: O1

void __thiscall
duckdb_moodycamel::
ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
::~ConcurrentQueue(ConcurrentQueue<duckdb::shared_ptr<duckdb::Task,_true>,_duckdb_moodycamel::ConcurrentQueueDefaultTraits>
                   *this)

{
  __pointer_type pPVar1;
  ProducerToken *pPVar2;
  __pointer_type pBVar3;
  __pointer_type __ptr;
  __pointer_type __ptr_00;
  __pointer_type pIVar4;
  __pointer_type pIVar5;
  __pointer_type __ptr_01;
  __pointer_type pPVar6;
  
  pPVar1 = (this->producerListTail)._M_b._M_p;
  __ptr = pPVar1;
  while (pPVar1 != (__pointer_type)0x0) {
    pPVar1 = (__pointer_type)(__ptr->super_ConcurrentQueueProducerTypelessBase).next;
    pPVar2 = (__ptr->super_ConcurrentQueueProducerTypelessBase).token;
    pPVar6 = (__pointer_type)&pPVar1[-1].parent;
    if (pPVar1 == (__pointer_type)0x0) {
      pPVar6 = (__pointer_type)0x0;
    }
    if (pPVar2 != (ProducerToken *)0x0) {
      pPVar2->producer = (ConcurrentQueueProducerTypelessBase *)0x0;
    }
    (**__ptr->_vptr_ProducerBase)(__ptr);
    free(__ptr);
    __ptr = pPVar6;
  }
  __ptr_01 = (this->implicitProducerHash)._M_b._M_p;
  if (__ptr_01 != (__pointer_type)0x0) {
    pIVar4 = __ptr_01->prev;
    while (pIVar5 = pIVar4, pIVar5 != (__pointer_type)0x0) {
      free(__ptr_01);
      __ptr_01 = pIVar5;
      pIVar4 = pIVar5->prev;
    }
  }
  pBVar3 = (this->freeList).freeListHead._M_b._M_p;
  while (__ptr_00 = pBVar3, __ptr_00 != (__pointer_type)0x0) {
    pBVar3 = (__ptr_00->freeListNext)._M_b._M_p;
    if (__ptr_00->dynamicallyAllocated == true) {
      free(__ptr_00);
    }
  }
  free(this->initialBlockPool);
  return;
}

Assistant:

~ConcurrentQueue()
	{
		// Destroy producers
		auto ptr = producerListTail.load(std::memory_order_relaxed);
		while (ptr != nullptr) {
			auto next = ptr->next_prod();
			if (ptr->token != nullptr) {
				ptr->token->producer = nullptr;
			}
			destroy(ptr);
			ptr = next;
		}
		
		// Destroy implicit producer hash tables
		MOODYCAMEL_CONSTEXPR_IF (INITIAL_IMPLICIT_PRODUCER_HASH_SIZE != 0) {
			auto hash = implicitProducerHash.load(std::memory_order_relaxed);
			while (hash != nullptr) {
				auto prev = hash->prev;
				if (prev != nullptr) {		// The last hash is part of this object and was not allocated dynamically
					for (size_t i = 0; i != hash->capacity; ++i) {
						hash->entries[i].~ImplicitProducerKVP();
					}
					hash->~ImplicitProducerHash();
					(Traits::free)(hash);
				}
				hash = prev;
			}
		}
		
		// Destroy global free list
		auto block = freeList.head_unsafe();
		while (block != nullptr) {
			auto next = block->freeListNext.load(std::memory_order_relaxed);
			if (block->dynamicallyAllocated) {
				destroy(block);
			}
			block = next;
		}
		
		// Destroy initial free list
		destroy_array(initialBlockPool, initialBlockPoolSize);
	}